

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkvalgrind.cpp
# Opt level: O2

QString * QBenchmarkValgrindUtils::getNewestFileName(void)

{
  int iVar1;
  storage_type *psVar2;
  long lVar3;
  QString *in_RDI;
  int iVar4;
  QFileInfo *pQVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  bool ok;
  QRegularExpressionMatch match;
  QRegularExpression rx;
  QArrayDataPointer<char16_t> local_c8;
  QFileInfo lastFileInfo;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<QFileInfo> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)0x0;
  local_58.size = 0;
  local_70.d = (QBenchmarkGlobalData::current->callgrindOutFileBase).d.d;
  local_70.ptr = (QBenchmarkGlobalData::current->callgrindOutFileBase).d.ptr;
  local_70.size = (QBenchmarkGlobalData::current->callgrindOutFileBase).d.size;
  if (local_70.d != (Data *)0x0) {
    LOCK();
    ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  psVar2 = (storage_type *)QByteArrayView::lengthHelperCharArray("%1.*",5);
  QVar6.m_data = psVar2;
  QVar6.m_size = (qsizetype)&local_a8;
  QString::fromLatin1(QVar6);
  QString::arg<QString,_true>
            ((QString *)&local_88,(QString *)&local_a8,(QString *)&local_70,0,(QChar)0x20);
  QList<QString>::emplaceBack<QString>((QList<QString> *)&local_58,(QString *)&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.ptr = (QFileInfo *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d = (Data *)0x0;
  local_a8.ptr = (char16_t *)0x0;
  local_a8.size = 0;
  QDir::QDir((QDir *)&local_c8,(QString *)&local_a8);
  iVar4 = -1;
  QDir::entryInfoList(&local_88,&local_c8,&local_58,0x12,0xffffffff);
  QDir::~QDir((QDir *)&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  _lastFileInfo = &DAT_aaaaaaaaaaaaaaaa;
  QFileInfo::QFileInfo(&lastFileInfo);
  local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  psVar2 = (storage_type *)QByteArrayView::lengthHelperCharArray("%1.(\\d+)",9);
  QVar7.m_data = psVar2;
  QVar7.m_size = (qsizetype)&local_c8;
  QString::fromLatin1(QVar7);
  QString::arg<QString,_true>
            ((QString *)&local_a8,(QString *)&local_c8,(QString *)&local_70,0,(QChar)0x20);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  _rx = &DAT_aaaaaaaaaaaaaaaa;
  QRegularExpression::QRegularExpression(&rx,&local_a8,0);
  pQVar5 = local_88.ptr;
  for (lVar3 = local_88.size << 3; lVar3 != 0; lVar3 = lVar3 + -8) {
    _match = &DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::fileName();
    QRegularExpression::match(&match,&rx,&local_c8,0,0,0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
    ok = true;
    QRegularExpressionMatch::captured((int)&local_c8);
    iVar1 = QString::toInt((QString *)&local_c8,&ok,10);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
    if (iVar4 < iVar1) {
      QFileInfo::operator=(&lastFileInfo,pQVar5);
      iVar4 = iVar1;
    }
    QRegularExpressionMatch::~QRegularExpressionMatch(&match);
    pQVar5 = pQVar5 + 8;
  }
  QFileInfo::fileName();
  QRegularExpression::~QRegularExpression(&rx);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  QFileInfo::~QFileInfo(&lastFileInfo);
  QArrayDataPointer<QFileInfo>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QBenchmarkValgrindUtils::getNewestFileName()
{
    QStringList nameFilters;
    QString base = QBenchmarkGlobalData::current->callgrindOutFileBase;
    Q_ASSERT(!base.isEmpty());

    nameFilters << QString::fromLatin1("%1.*").arg(base);
    const QFileInfoList fiList = QDir().entryInfoList(nameFilters, QDir::Files | QDir::Readable);
    Q_ASSERT(!fiList.empty());
    int hiSuffix = -1;
    QFileInfo lastFileInfo;
    const QString pattern = QString::fromLatin1("%1.(\\d+)").arg(base);
    QRegularExpression rx(pattern);
    for (const QFileInfo &fileInfo : fiList) {
        QRegularExpressionMatch match = rx.match(fileInfo.fileName());
        Q_ASSERT(match.hasMatch());
        bool ok;
        const int suffix = match.captured(1).toInt(&ok);
        Q_ASSERT(ok);
        Q_ASSERT(suffix >= 0);
        if (suffix > hiSuffix) {
            lastFileInfo = fileInfo;
            hiSuffix = suffix;
        }
    }

    return lastFileInfo.fileName();
}